

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::doeltoutput
               (int samplesize,bool skipHeader,bool ordOutput,FILE **fout,
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parquetFileNames)

{
  long lVar1;
  bool bVar2;
  pointer pfVar3;
  pointer pfVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  vector<float,_std::allocator<float>_> losses_vec;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  uint local_90;
  float local_8c;
  FILE *local_88;
  code *local_80;
  summarySampleslevelHeader local_74;
  ulong local_68;
  float local_5c;
  vector<float,_std::allocator<float>_> local_58;
  timespec local_40;
  
  uVar7 = (ulong)(uint)samplesize;
  if ((int)CONCAT71(in_register_00000011,ordOutput) == 0) {
    if ((parquetFileNames->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      bVar2 = true;
      local_80 = (code *)0x0;
      local_88 = (FILE *)0x0;
      goto LAB_00102dbf;
    }
    if (!skipHeader) {
      puts("summary_id,type,event_id,mean,standard_deviation,exposure_value");
    }
    local_88 = _stdout;
    local_80 = OutputRows;
  }
  else {
    if (!skipHeader) {
      if ((FILE *)*fout != (FILE *)0x0) {
        fwrite("EventId,SummaryId,SampleType,EventRate,ChanceOfLoss,MeanLoss,SDLoss,MaxLoss,FootprintExposure,MeanImpactedExposure,MaxImpactedExposure\n"
               ,0x87,1,(FILE *)*fout);
      }
      if ((FILE *)fout[1] != (FILE *)0x0) {
        fwrite("EventId,SummaryId,Quantile,Loss\n",0x20,1,(FILE *)fout[1]);
      }
    }
    local_88 = *fout;
    local_80 = OutputRowsORD;
  }
  bVar2 = false;
LAB_00102dbf:
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (fout[1] != (FILE *)0x0) {
    local_40.tv_sec = local_40.tv_sec & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::resize
              (&local_58,(long)samplesize,(value_type_conflict *)&local_40);
  }
  sVar5 = fread(&local_74,0xc,1,_stdin);
  if (sVar5 != 0) {
    fVar10 = (float)samplesize;
    local_5c = (float)(samplesize + -1);
    local_ac = 0.0;
    local_68 = uVar7;
    do {
      sVar5 = fread(&local_90,8,1,_stdin);
      bVar9 = sVar5 != 0;
      local_b4 = 0.0;
      local_9c = 0.0;
      local_a8 = 0.0;
      local_a0 = 0.0;
      local_b8 = 0.0;
      local_98 = 0.0;
      local_b0 = 0.0;
      if (local_90 != 0 && bVar9) {
        iVar8 = 0;
        local_b0 = 0.0;
        local_98 = 0.0;
        local_b8 = 0.0;
        local_a0 = 0.0;
        local_9c = 0.0;
        local_b4 = 0.0;
        do {
          if ((int)local_90 < 1) {
            if (local_90 == 0xfffffffb) {
              local_a0 = local_8c;
            }
            else if (local_90 == 0xffffffff) {
              local_98 = local_8c;
            }
          }
          else {
            if (fout[1] != (FILE *)0x0) {
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)local_90 - 1] = local_8c;
            }
            local_b0 = local_b0 + local_8c;
            local_b8 = local_b8 + local_8c * local_8c;
            if (0.0 < local_8c) {
              local_b4 = local_b4 + local_74.expval;
              fVar11 = local_74.expval;
              if (local_74.expval <= local_9c) {
                fVar11 = local_9c;
              }
              iVar8 = iVar8 + 1;
              local_9c = fVar11;
            }
          }
          sVar5 = fread(&local_90,8,1,_stdin);
          bVar9 = sVar5 != 0;
        } while ((bVar9) && (local_90 != 0));
        local_a8 = (float)iVar8;
      }
      iVar8 = (int)uVar7;
      if (iVar8 < 2) {
        fVar11 = 0.0;
        if (iVar8 != 0) {
          fVar11 = local_ac;
        }
        if (iVar8 == 1) {
          fVar11 = local_b0;
        }
        local_a8 = 0.0;
        local_b8 = 0.0;
        local_ac = fVar11;
      }
      else {
        fVar12 = (local_b8 - (local_b0 * local_b0) / fVar10) / local_5c;
        fVar11 = 0.0;
        if (1e-07 <= fVar12 / local_b8) {
          fVar11 = fVar12;
        }
        if (fVar11 < 0.0) {
          local_b8 = sqrtf(fVar11);
        }
        else {
          local_b8 = SQRT(fVar11);
        }
        local_b4 = local_b4 / fVar10;
        local_a8 = local_a8 / fVar10;
        local_ac = local_b0 / fVar10;
      }
      if (0.0 < local_74.expval) {
        if (!bVar2) {
          (*local_80)(local_98,0,local_74.expval,local_74.expval,0,local_a0,&local_74,1,local_88);
        }
        uVar7 = local_68;
        if (firstOutput == '\x01') {
          local_40.tv_sec = 1;
          local_40.tv_nsec = 0;
          do {
            iVar8 = nanosleep(&local_40,&local_40);
            if (iVar8 != -1) break;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
          firstOutput = '\0';
        }
        if ((int)uVar7 != 0) {
          if (!bVar2) {
            (*local_80)(local_ac,local_b8,local_b4,local_9c,local_a8,local_a0,&local_74,2,local_88);
          }
          pfVar4 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pfVar3 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = local_68;
          if (fout[1] != (FILE *)0x0) {
            if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar7 = (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              lVar1 = 0x3f;
              if (uVar7 != 0) {
                for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pfVar3,pfVar4);
            }
            OutputQuantiles(&local_74,&local_58,fout[1]);
            uVar7 = local_68;
            if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memset(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,0,
                     ((long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                      (-4 - (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
            }
          }
        }
      }
    } while ((bVar9) && (sVar5 = fread(&local_74,0xc,1,_stdin), sVar5 != 0));
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void doeltoutput(int samplesize, bool skipHeader, bool ordOutput,
			 FILE **fout,
			 std::map<int, std::string> &parquetFileNames)
	{
		OASIS_FLOAT sumloss = 0.0;
		OASIS_FLOAT sample_mean = 0.0;
		OASIS_FLOAT analytical_mean = 0.0;
		OASIS_FLOAT sd = 0;
		OASIS_FLOAT sumlosssqr = 0.0;
		void (*OutputData)(const summarySampleslevelHeader&, const int,
				   const OASIS_FLOAT, const OASIS_FLOAT, FILE*,
				   const OASIS_FLOAT, const OASIS_FLOAT,
				   const OASIS_FLOAT, const OASIS_FLOAT);
		OutputData = nullptr;
		FILE * outFile = nullptr;
		if (ordOutput) {
			if (skipHeader == false) {
				if (fout[MELT] != nullptr) {
					fprintf(fout[MELT],
						"EventId,SummaryId,SampleType,"
						"EventRate,ChanceOfLoss,"
						"MeanLoss,SDLoss,MaxLoss,"
						"FootprintExposure,"
						"MeanImpactedExposure,"
						"MaxImpactedExposure\n");
				}
				if (fout[QELT] != nullptr) {
					fprintf(fout[QELT], "EventId,SummaryId,Quantile,Loss\n");
				}
			}
			OutputData = &eltcalc::OutputRowsORD;
			outFile = fout[MELT];
		} else if (parquetFileNames.size() == 0) {
			if (skipHeader == false) {
				printf("summary_id,type,event_id,mean,standard_deviation,exposure_value\n");
			}
			OutputData = &eltcalc::OutputRows;
			outFile = stdout;
		}

#ifdef HAVE_PARQUET
		std::map<int, parquet::StreamWriter> os;
		for (auto iter = parquetFileNames.begin();
		  iter != parquetFileNames.end(); ++iter)  {
			os[iter->first] = OasisParquet::GetParquetStreamWriter(iter->first, iter->second);
		}
#endif

		// Losses for calculating quantiles
		std::vector<OASIS_FLOAT> losses_vec;
#ifdef HAVE_PARQUET
		if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
		if (fout[QELT] != nullptr)
#endif
		{
			losses_vec.resize(samplesize, 0);
		}

		summarySampleslevelHeader sh;
		size_t i = fread(&sh, sizeof(sh), 1, stdin);
		while (i != 0) {
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			int non_zero_samples = 0;
			OASIS_FLOAT max_loss = 0;
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, stdin);
			while (i != 0 && sr.sidx != 0) {
				if (sr.sidx > 0) {
					sumloss += sr.loss;
					sumlosssqr += (sr.loss * sr.loss);
#ifdef HAVE_PARQUET
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						losses_vec[sr.sidx-1] = sr.loss;
					}
					if (sr.loss > 0) {
						mean_impacted_exposure += sh.expval;
						if (sh.expval > max_impacted_exposure) {
							max_impacted_exposure = sh.expval;
						}
						non_zero_samples++;
					}
				} else if (sr.sidx == -1) {
					analytical_mean = sr.loss;
				} else if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				}
				i = fread(&sr, sizeof(sr), 1, stdin);
			}
			if (samplesize > 1) {
				sample_mean = sumloss / samplesize;
				sd = (sumlosssqr - ((sumloss*sumloss) / samplesize)) / (samplesize - 1);
				OASIS_FLOAT x = sd / sumlosssqr;
				if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
				sd = sqrt(sd);
				mean_impacted_exposure /= samplesize;
				chance_of_loss = non_zero_samples / (OASIS_FLOAT)samplesize;   // relative frequency
			}
			else {
				if (samplesize == 0) {
					sd = 0;
					sample_mean = 0;
				}
				if (samplesize == 1) {
					sample_mean = sumloss / samplesize;
					sd = 0;
				}
			}
			if (sh.expval > 0) {   // only output rows with a non-zero exposure value
				if (OutputData != nullptr) {
					OutputData(sh, 1, analytical_mean, 0,
						   outFile, sh.expval,
						   sh.expval, 0.0, max_loss);
				}
#ifdef HAVE_PARQUET
				if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
					OutputRowsParquet(sh, 1,
							  analytical_mean, 0,
							  os[OasisParquet::MELT],
							  sh.expval, sh.expval,
							  0.0, max_loss);
				}
#endif
				if (firstOutput == true) {
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY)); // used to stop possible race condition with kat
					firstOutput = false;
				}
				if (samplesize) {
					if (OutputData != nullptr) {
						OutputData(sh, 2, sample_mean,
							   sd, outFile,
							   mean_impacted_exposure,
							   max_impacted_exposure,
							   chance_of_loss,
							   max_loss);
					}
#ifdef HAVE_PARQUET
					if (parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
						OutputRowsParquet(sh, 2,
								  sample_mean,
								  sd,
								  os[OasisParquet::MELT],
								  mean_impacted_exposure,
								  max_impacted_exposure,
								  chance_of_loss,
								  max_loss);
					}
					if (fout[QELT] != nullptr || parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end())
#else
					if (fout[QELT] != nullptr)
#endif
					{
						std::sort(losses_vec.begin(), losses_vec.end());
#ifdef HAVE_PARQUET
						OutputQuantiles(sh, losses_vec, fout[QELT], os);
#else
						OutputQuantiles(sh, losses_vec, fout[QELT]);
#endif
						std::fill(losses_vec.begin(), losses_vec.end(), 0);
					}
				}
			}


			if (i) i = fread(&sh, sizeof(sh), 1, stdin);

			sumloss = 0.0;
			sumlosssqr = 0.0;
			sd = 0.0;
			analytical_mean = 0.0;
		}

	}
	void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, stdin);

#ifdef HAVE_PARQUET
		if ((ordOutput && fout[MELT] != nullptr) ||
		    parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
			GetEventRates();
		}
#else
		if (ordOutput && fout[MELT] != nullptr) GetEventRates();
#endif

		if (isSummaryCalcStream(stream_type) == true) {
			unsigned int samplesize;
			unsigned int summaryset_id;
			i = fread(&samplesize, sizeof(samplesize), 1, stdin);

#ifdef HAVE_PARQUET
			if ((ordOutput && fout[QELT] != nullptr) ||
			    parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end()) {
				GetIntervals(samplesize);
			}
#else
			if (ordOutput && fout[QELT] != nullptr) GetIntervals(samplesize);
#endif

			if (i == 1) i = fread(&summaryset_id,
					      sizeof(summaryset_id), 1, stdin);
			if (i == 1) {
				doeltoutput(samplesize, skipHeader, ordOutput,
					    fout, parquetFileNames);
			}
			else {
				fprintf(stderr, "FATAL: Stream read error\n");
			}
			return;
		}

		fprintf(stderr, "FATAL: %s: Not a gul stream\n", __func__);
		fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__, stream_type);
		exit(-1);
	}


	void touch(const std::string &filepath)
	{
		FILE *fout = fopen(filepath.c_str(), "wb");
		fclose(fout);
	}
	void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}
}